

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

long __thiscall Jupiter::IRC::Client::readConfigLong(Client *this,string_view key,long defaultValue)

{
  Config *this_00;
  string_view in_key;
  bool bVar1;
  long lVar2;
  string_view local_60;
  size_t local_50;
  char *local_48;
  undefined1 local_40 [8];
  string_view val;
  long defaultValue_local;
  Client *this_local;
  string_view key_local;
  
  val._M_str = (char *)defaultValue;
  if (this->m_primary_section != (Config *)0x0) {
    this_00 = this->m_primary_section;
    local_50 = key._M_len;
    local_48 = key._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
    in_key._M_str = local_48;
    in_key._M_len = local_50;
    _local_40 = Config::get(this_00,in_key,local_60);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    if (!bVar1) {
      lVar2 = from_string<long>(_local_40);
      return lVar2;
    }
  }
  if (this->m_secondary_section == (Config *)0x0) {
    key_local._M_str = val._M_str;
  }
  else {
    key_local._M_str = (char *)Config::get<long>(this->m_secondary_section,key,(long)val._M_str);
  }
  return (long)key_local._M_str;
}

Assistant:

long Jupiter::IRC::Client::readConfigLong(std::string_view key, long defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<long>(val);
		}
	}

	if (m_secondary_section != nullptr)
		return m_secondary_section->get<long>(key, defaultValue);

	return defaultValue;
}